

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

char * Extra_FileReadContents(char *pFileName)

{
  FILE *__stream;
  char *local_28;
  char *pBuffer;
  FILE *pFile;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    local_28 = (char *)0x0;
  }
  else {
    local_28 = Extra_FileRead((FILE *)__stream);
    fclose(__stream);
  }
  return local_28;
}

Assistant:

char * Extra_FileReadContents( char * pFileName )
{
    FILE * pFile;
    char * pBuffer;
    pFile = fopen( pFileName, "rb" );
    pBuffer = pFile ? Extra_FileRead( pFile ) : NULL;
    if ( pFile )  fclose( pFile );
    return pBuffer;
}